

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O0

void __thiscall QGnomeThemePrivate::updateColorScheme(QGnomeThemePrivate *this,QString *themeName)

{
  long lVar1;
  QLatin1StringView s;
  QLatin1StringView s_00;
  bool bVar2;
  QString *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  ColorScheme oldColorScheme;
  QString *in_stack_ffffffffffffffa8;
  QString *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  QString *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = *(int *)(in_RDI + 0x58);
  this_00 = in_RSI;
  QLatin1String::QLatin1String
            ((QLatin1String *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),(char *)in_RSI);
  s.m_size._4_4_ = iVar3;
  s.m_size._0_4_ = in_stack_ffffffffffffffc0;
  s.m_data = (char *)this_00;
  bVar2 = QString::contains(in_stack_ffffffffffffffa8,s,CaseInsensitive);
  if (bVar2) {
    *(undefined4 *)(in_RDI + 0x58) = 1;
  }
  else {
    pQVar4 = this_00;
    QLatin1String::QLatin1String
              ((QLatin1String *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),(char *)in_RSI);
    s_00.m_size._4_4_ = iVar3;
    s_00.m_size._0_4_ = in_stack_ffffffffffffffc0;
    s_00.m_data = (char *)pQVar4;
    bVar2 = QString::contains(this_00,s_00,CaseInsensitive);
    if (bVar2) {
      *(undefined4 *)(in_RDI + 0x58) = 2;
    }
    else {
      *(undefined4 *)(in_RDI + 0x58) = 0;
    }
  }
  if (iVar3 != *(int *)(in_RDI + 0x58)) {
    QWindowSystemInterface::handleThemeChange<QWindowSystemInterface::DefaultDelivery>();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGnomeThemePrivate::updateColorScheme(const QString &themeName)
{
    const auto oldColorScheme = m_colorScheme;
    if (themeName.contains(QLatin1StringView("light"), Qt::CaseInsensitive)) {
        m_colorScheme = Qt::ColorScheme::Light;
    } else if (themeName.contains(QLatin1StringView("dark"), Qt::CaseInsensitive)) {
        m_colorScheme = Qt::ColorScheme::Dark;
    } else {
        m_colorScheme = Qt::ColorScheme::Unknown;
    }

    if (oldColorScheme != m_colorScheme)
        QWindowSystemInterface::handleThemeChange();
}